

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_free(_glist *x)

{
  void *fatso;
  int oldstate;
  _glist *p_Var1;
  int dspstate;
  t_canvas_private *private;
  t_gobj *y;
  _glist *x_local;
  
  fatso = x->gl_privatedata;
  oldstate = canvas_suspend_dsp();
  canvas_noundo(x);
  if (canvas_whichfind == x) {
    canvas_whichfind = (_glist *)0x0;
  }
  glist_noselect(x);
  while (x->gl_list != (t_gobj *)0x0) {
    glist_delete(x,x->gl_list);
  }
  p_Var1 = glist_getcanvas(x);
  if (x == p_Var1) {
    canvas_vis(x,0.0);
  }
  if (x->gl_editor != (t_editor *)0x0) {
    canvas_destroy_editor(x);
  }
  canvas_unbind(x);
  if (x->gl_env != (_canvasenvironment *)0x0) {
    freebytes(x->gl_env->ce_argv,(long)x->gl_env->ce_argc << 4);
    freebytes(x->gl_env,0x28);
  }
  canvas_undo_free(x);
  freebytes(fatso,0x20);
  canvas_resume_dsp(oldstate);
  freebytes(x->gl_xlabel,(long)x->gl_nxlabels << 3);
  freebytes(x->gl_ylabel,(long)x->gl_nylabels << 3);
  gstub_cutoff(x->gl_stub);
  pdgui_stub_deleteforkey(x);
  if ((x->gl_owner == (_glist *)0x0) && ((*(ushort *)&x->field_0xe8 >> 0xb & 1) == 0)) {
    canvas_takeofflist(x);
  }
  return;
}

Assistant:

void canvas_free(t_canvas *x)
{
    t_gobj *y;
    t_canvas_private*private = x->gl_privatedata;
    int dspstate = canvas_suspend_dsp();
    canvas_noundo(x);
    if (canvas_whichfind == x)
        canvas_whichfind = 0;
    glist_noselect(x);
    while ((y = x->gl_list))
        glist_delete(x, y);
    if (x == glist_getcanvas(x))
        canvas_vis(x, 0);
    if (x->gl_editor)
        canvas_destroy_editor(x);   /* bug workaround; should already be gone*/
    canvas_unbind(x);

    if (x->gl_env)
    {
        freebytes(x->gl_env->ce_argv, x->gl_env->ce_argc * sizeof(t_atom));
        freebytes(x->gl_env, sizeof(*x->gl_env));
    }
    canvas_undo_free(x);
    freebytes(private, sizeof(*private));
    canvas_resume_dsp(dspstate);
    freebytes(x->gl_xlabel, x->gl_nxlabels * sizeof(*(x->gl_xlabel)));
    freebytes(x->gl_ylabel, x->gl_nylabels * sizeof(*(x->gl_ylabel)));
    gstub_cutoff(x->gl_stub);
    pdgui_stub_deleteforkey(x);        /* probably unnecessary */
    if (!x->gl_owner && !x->gl_isclone)
        canvas_takeofflist(x);
}